

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_format_tar_sparse.c
# Opt level: O3

void test_write_format_tar_sparse(void)

{
  undefined1 auVar1 [16];
  int iVar2;
  mode_t mVar3;
  wchar_t wVar4;
  void *pvVar5;
  archive *paVar6;
  time_t tVar7;
  long lVar8;
  char *pcVar9;
  la_ssize_t lVar10;
  la_int64_t lVar11;
  archive *paVar12;
  archive_entry *entry;
  size_t s;
  ulong uVar13;
  bool bVar14;
  archive_entry *ae;
  size_t used;
  int64_t length;
  int64_t offset;
  char buff3 [1024];
  archive_entry *local_470;
  archive *local_468;
  archive *local_460;
  size_t local_458;
  longlong local_450;
  longlong local_448;
  ulong local_440;
  undefined1 local_438 [1032];
  
  pvVar5 = malloc(0x13000);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                   ,L'+',(uint)(pvVar5 != (void *)0x0),"(buff2 = malloc(buff2_size)) != NULL",
                   (void *)0x0);
  uVar13 = 1;
  local_468 = (archive *)pvVar5;
  do {
    paVar6 = archive_write_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                     ,L'/',(uint)(paVar6 != (archive *)0x0),"(a = archive_write_new()) != NULL",
                     (void *)0x0);
    iVar2 = archive_write_set_format_pax(paVar6);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                        ,L'1',0,"ARCHIVE_OK",(long)iVar2,"archive_write_set_format_pax(a)",paVar6);
    iVar2 = archive_write_add_filter_none(paVar6);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                        ,L'3',0,"ARCHIVE_OK",(long)iVar2,"archive_write_add_filter_none(a)",paVar6);
    iVar2 = archive_write_set_bytes_per_block(paVar6,(int)uVar13);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                        ,L'5',0,"ARCHIVE_OK",(long)iVar2,
                        "archive_write_set_bytes_per_block(a, (int)blocksize)",paVar6);
    iVar2 = archive_write_set_bytes_in_last_block(paVar6,(int)uVar13);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                        ,L'7',0,"ARCHIVE_OK",(long)iVar2,
                        "archive_write_set_bytes_in_last_block(a, (int)blocksize)",paVar6);
    iVar2 = archive_write_get_bytes_in_last_block(paVar6);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                        ,L'9',uVar13,"blocksize",(long)iVar2,
                        "archive_write_get_bytes_in_last_block(a)",(void *)0x0);
    iVar2 = archive_write_open_memory(paVar6,buff,1000000,&local_458);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                        ,L';',0,"ARCHIVE_OK",(long)iVar2,
                        "archive_write_open_memory(a, buff, sizeof(buff), &used)",paVar6);
    iVar2 = archive_write_get_bytes_in_last_block(paVar6);
    local_440 = uVar13;
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                        ,L'=',uVar13,"blocksize",(long)iVar2,
                        "archive_write_get_bytes_in_last_block(a)",(void *)0x0);
    local_470 = archive_entry_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                     ,L'B',(uint)(local_470 != (archive_entry *)0x0),
                     "(ae = archive_entry_new()) != NULL",(void *)0x0);
    archive_entry_set_mtime(local_470,1,10);
    tVar7 = archive_entry_mtime(local_470);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                        ,L'D',1,"1",tVar7,"archive_entry_mtime(ae)",(void *)0x0);
    lVar8 = archive_entry_mtime_nsec(local_470);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                        ,L'E',10,"10",lVar8,"archive_entry_mtime_nsec(ae)",(void *)0x0);
    archive_entry_copy_pathname(local_470,"file");
    pcVar9 = archive_entry_pathname(local_470);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
               ,L'G',"file","\"file\"",pcVar9,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
    archive_entry_set_mode(local_470,0x81ed);
    mVar3 = archive_entry_mode(local_470);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                        ,L'I',0x81ed,"S_IFREG | 0755",(ulong)mVar3,"archive_entry_mode(ae)",
                        (void *)0x0);
    archive_entry_set_size(local_470,0x81000);
    archive_entry_sparse_add_entry(local_470,0x10000,0x1000);
    archive_entry_sparse_add_entry(local_470,0x80000,0x1000);
    iVar2 = archive_write_header(paVar6,local_470);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                        ,L'N',0,"ARCHIVE_OK",(long)iVar2,"archive_write_header(a, ae)",paVar6);
    archive_entry_free(local_470);
    memset(local_468,0x61,0x13000);
    uVar13 = 0;
    do {
      s = 0x81000 - uVar13;
      if (uVar13 < 0x6e001) {
        s = 0x13000;
      }
      lVar10 = archive_write_data(paVar6,local_468,s);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                          ,L'V',s,"ws",lVar10,"archive_write_data(a, buff2, ws)",(void *)0x0);
      uVar13 = uVar13 + s;
    } while (uVar13 < 0x81000);
    iVar2 = archive_write_close(paVar6);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                        ,L'[',0,"ARCHIVE_OK",(long)iVar2,"archive_write_close(a)",paVar6);
    iVar2 = archive_write_free(paVar6);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                        ,L'\\',0,"ARCHIVE_OK",(long)iVar2,"archive_write_free(a)",(void *)0x0);
    uVar13 = local_440;
    failure("blocksize=%zu",local_440);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar13;
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                        ,L'a',(SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x2bff)) / auVar1,0) + 1) *
                              uVar13,"((11264 - 1)/blocksize+1)*blocksize",local_458,"used",
                        (void *)0x0);
    paVar6 = archive_read_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                     ,L'f',(uint)(paVar6 != (archive *)0x0),"(a = archive_read_new()) != NULL",
                     (void *)0x0);
    iVar2 = archive_read_support_format_all(paVar6);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                        ,L'h',0,"ARCHIVE_OK",(long)iVar2,"archive_read_support_format_all(a)",paVar6
                       );
    iVar2 = archive_read_support_filter_all(paVar6);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                        ,L'j',0,"ARCHIVE_OK",(long)iVar2,"archive_read_support_filter_all(a)",paVar6
                       );
    iVar2 = archive_read_open_memory(paVar6,buff,local_458);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                        ,L'l',0,"ARCHIVE_OK",(long)iVar2,"archive_read_open_memory(a, buff, used)",
                        paVar6);
    iVar2 = archive_read_next_header(paVar6,&local_470);
    local_460 = paVar6;
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                        ,L'o',0,"ARCHIVE_OK",(long)iVar2,"archive_read_next_header(a, &ae)",paVar6);
    tVar7 = archive_entry_mtime(local_470);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                        ,L'q',1,"1",tVar7,"archive_entry_mtime(ae)",(void *)0x0);
    lVar8 = archive_entry_mtime_nsec(local_470);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                        ,L'r',10,"10",lVar8,"archive_entry_mtime_nsec(ae)",(void *)0x0);
    tVar7 = archive_entry_atime(local_470);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                        ,L's',0,"0",tVar7,"archive_entry_atime(ae)",(void *)0x0);
    tVar7 = archive_entry_ctime(local_470);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                        ,L't',0,"0",tVar7,"archive_entry_ctime(ae)",(void *)0x0);
    pcVar9 = archive_entry_pathname(local_470);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
               ,L'u',"file","\"file\"",pcVar9,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
    mVar3 = archive_entry_filetype(local_470);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                        ,L'v',0x8000,"AE_IFREG",(ulong)mVar3,"archive_entry_filetype(ae)",
                        (void *)0x0);
    mVar3 = archive_entry_mode(local_470);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                        ,L'w',0x81ed,"AE_IFREG | 0755",(ulong)mVar3,"archive_entry_mode(ae)",
                        (void *)0x0);
    lVar11 = archive_entry_size(local_470);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                        ,L'x',0x81000,"0x81000",lVar11,"archive_entry_size(ae)",(void *)0x0);
    wVar4 = archive_entry_sparse_reset(local_470);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                        ,L'z',2,"2",(long)wVar4,"archive_entry_sparse_reset(ae)",(void *)0x0);
    wVar4 = archive_entry_sparse_next(local_470,&local_448,&local_450);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                        ,L'|',0,"0",(long)wVar4,"archive_entry_sparse_next(ae, &offset, &length)",
                        (void *)0x0);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                        ,L'}',0x10000,"0x10000",local_448,"offset",(void *)0x0);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                        ,L'~',0x1000,"0x1000",local_450,"length",(void *)0x0);
    wVar4 = archive_entry_sparse_next(local_470,&local_448,&local_450);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                        ,L'\x80',0,"0",(long)wVar4,"archive_entry_sparse_next(ae, &offset, &length)"
                        ,(void *)0x0);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                        ,L'\x81',0x80000,"0x80000",local_448,"offset",(void *)0x0);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                        ,L'\x82',0x1000,"0x1000",local_450,"length",(void *)0x0);
    memset(local_438,0,0x400);
    uVar13 = 0;
    paVar6 = local_468;
    do {
      lVar10 = archive_read_data(local_460,paVar6,0x400);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                          ,L'\x86',0x400,"1024",lVar10,"archive_read_data(a, buff2, 1024)",
                          (void *)0x0);
      failure("Read data(0x%lx - 0x%lx) should be all zero",uVar13,uVar13 + 0x400);
      paVar6 = local_468;
      assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                          ,L'\x89',local_468,"buff2",local_438,"buff3",0x400,"1024",(void *)0x0);
      bVar14 = uVar13 < 0xfc00;
      uVar13 = uVar13 + 0x400;
    } while (bVar14);
    memset(local_438,0x61,0x400);
    uVar13 = 0x10000;
    do {
      lVar10 = archive_read_data(local_460,paVar6,0x400);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                          ,L'\x8d',0x400,"1024",lVar10,"archive_read_data(a, buff2, 1024)",
                          (void *)0x0);
      failure("Read data(0x%lx - 0x%lx) should be all \'a\'",uVar13,uVar13 + 0x400);
      paVar6 = local_468;
      assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                          ,L'\x90',local_468,"buff2",local_438,"buff3",0x400,"1024",(void *)0x0);
      bVar14 = uVar13 < 0x10c00;
      uVar13 = uVar13 + 0x400;
    } while (bVar14);
    memset(local_438,0,0x400);
    paVar12 = local_460;
    uVar13 = 0x11000;
    do {
      lVar10 = archive_read_data(paVar12,paVar6,0x400);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                          ,L'\x94',0x400,"1024",lVar10,"archive_read_data(a, buff2, 1024)",
                          (void *)0x0);
      failure("Read data(0x%lx - 0x%lx) should be all zero",uVar13,uVar13 + 0x400);
      assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                          ,L'\x97',paVar6,"buff2",local_438,"buff3",0x400,"1024",(void *)0x0);
      bVar14 = uVar13 < 0x7fc00;
      uVar13 = uVar13 + 0x400;
    } while (bVar14);
    memset(local_438,0x61,0x400);
    uVar13 = 0x80000;
    do {
      lVar10 = archive_read_data(paVar12,paVar6,0x400);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                          ,L'\x9b',0x400,"1024",lVar10,"archive_read_data(a, buff2, 1024)",
                          (void *)0x0);
      failure("Read data(0x%lx - 0x%lx) should be all \'a\'",uVar13,uVar13 + 0x400);
      assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                          ,L'\x9e',paVar6,"buff2",local_438,"buff3",0x400,"1024",(void *)0x0);
      bVar14 = uVar13 < 0x80c00;
      uVar13 = uVar13 + 0x400;
    } while (bVar14);
    iVar2 = archive_read_next_header(paVar12,&local_470);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                        ,L'£',1,"ARCHIVE_EOF",(long)iVar2,"archive_read_next_header(a, &ae)",
                        paVar12);
    iVar2 = archive_read_close(paVar12);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                        ,L'¤',0,"ARCHIVE_OK",(long)iVar2,"archive_read_close(a)",paVar12);
    iVar2 = archive_read_free(paVar12);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                        ,L'¥',0,"ARCHIVE_OK",(long)iVar2,"archive_read_free(a)",(void *)0x0);
    uVar13 = local_440 * 2 + 3;
  } while (local_440 < 49999);
  free(paVar6);
  local_460 = (archive *)malloc(0x11000);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                   ,L'º',(uint)(local_460 != (archive *)0x0),"(buff2 = malloc(buff2_size)) != NULL"
                   ,(void *)0x0);
  paVar12 = archive_write_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                   ,L'¼',(uint)(paVar12 != (archive *)0x0),"(a = archive_write_new()) != NULL",
                   (void *)0x0);
  iVar2 = archive_write_set_format_pax(paVar12);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                      ,L'¾',0,"ARCHIVE_OK",(long)iVar2,"archive_write_set_format_pax(a)",paVar12);
  iVar2 = archive_write_add_filter_none(paVar12);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                      ,L'À',0,"ARCHIVE_OK",(long)iVar2,"archive_write_add_filter_none(a)",paVar12);
  iVar2 = archive_write_set_bytes_per_block(paVar12,0x2800);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                      ,L'Â',0,"ARCHIVE_OK",(long)iVar2,
                      "archive_write_set_bytes_per_block(a, (int)blocksize)",paVar12);
  iVar2 = archive_write_set_bytes_in_last_block(paVar12,0x2800);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                      ,L'Ä',0,"ARCHIVE_OK",(long)iVar2,
                      "archive_write_set_bytes_in_last_block(a, (int)blocksize)",paVar12);
  iVar2 = archive_write_get_bytes_in_last_block(paVar12);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                      ,L'Æ',0x2800,"blocksize",(long)iVar2,
                      "archive_write_get_bytes_in_last_block(a)",(void *)0x0);
  iVar2 = archive_write_open_memory(paVar12,buff,1000000,&local_458);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                      ,L'È',0,"ARCHIVE_OK",(long)iVar2,
                      "archive_write_open_memory(a, buff, sizeof(buff), &used)",paVar12);
  iVar2 = archive_write_get_bytes_in_last_block(paVar12);
  paVar6 = local_460;
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                      ,L'Ê',0x2800,"blocksize",(long)iVar2,
                      "archive_write_get_bytes_in_last_block(a)",(void *)0x0);
  entry = archive_entry_new();
  local_470 = entry;
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                   ,L'Ï',(uint)(entry != (archive_entry *)0x0),"(ae = archive_entry_new()) != NULL"
                   ,(void *)0x0);
  archive_entry_set_mtime(entry,1,10);
  tVar7 = archive_entry_mtime(entry);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                      ,L'Ñ',1,"1",tVar7,"archive_entry_mtime(ae)",(void *)0x0);
  lVar8 = archive_entry_mtime_nsec(entry);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                      ,L'Ò',10,"10",lVar8,"archive_entry_mtime_nsec(ae)",(void *)0x0);
  archive_entry_copy_pathname(entry,"file");
  pcVar9 = archive_entry_pathname(entry);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
             ,L'Ô',"file","\"file\"",pcVar9,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
  archive_entry_set_mode(entry,0x81ed);
  mVar3 = archive_entry_mode(entry);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                      ,L'Ö',0x81ed,"S_IFREG | 0755",(ulong)mVar3,"archive_entry_mode(ae)",
                      (void *)0x0);
  archive_entry_set_size(entry,0x81000);
  archive_entry_sparse_add_entry(entry,0x10000,0x1000);
  archive_entry_sparse_add_entry(entry,0x80000,0x1000);
  iVar2 = archive_write_header(paVar12,entry);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                      ,L'Û',0,"ARCHIVE_OK",(long)iVar2,"archive_write_header(a, ae)",paVar12);
  archive_entry_free(entry);
  memset(paVar6,0x61,0x11000);
  lVar10 = archive_write_data(paVar12,paVar6,0x11000);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                      ,L'ß',0x11000,"buff2_size",lVar10,"archive_write_data(a, buff2, buff2_size)",
                      (void *)0x0);
  iVar2 = archive_write_close(paVar12);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                      ,L'â',0,"ARCHIVE_OK",(long)iVar2,"archive_write_close(a)",paVar12);
  iVar2 = archive_write_free(paVar12);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                      ,L'ã',0,"ARCHIVE_OK",(long)iVar2,"archive_write_free(a)",(void *)0x0);
  failure("blocksize=%zu",0x2800);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                      ,L'è',0x5000,"((11264 - 1)/blocksize+1)*blocksize",local_458,"used",
                      (void *)0x0);
  paVar12 = archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                   ,L'í',(uint)(paVar12 != (archive *)0x0),"(a = archive_read_new()) != NULL",
                   (void *)0x0);
  iVar2 = archive_read_support_format_all(paVar12);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                      ,L'î',0,"ARCHIVE_OK",(long)iVar2,"archive_read_support_format_all(a)",paVar12
                     );
  iVar2 = archive_read_support_filter_all(paVar12);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                      ,L'ï',0,"ARCHIVE_OK",(long)iVar2,"archive_read_support_filter_all(a)",paVar12
                     );
  iVar2 = archive_read_open_memory(paVar12,buff,local_458);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                      ,L'ð',0,"ARCHIVE_OK",(long)iVar2,"archive_read_open_memory(a, buff, used)",
                      paVar12);
  iVar2 = archive_read_next_header(paVar12,&local_470);
  local_468 = paVar12;
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                      ,L'ò',0,"ARCHIVE_OK",(long)iVar2,"archive_read_next_header(a, &ae)",paVar12);
  tVar7 = archive_entry_mtime(local_470);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                      ,L'ô',1,"1",tVar7,"archive_entry_mtime(ae)",(void *)0x0);
  lVar8 = archive_entry_mtime_nsec(local_470);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                      ,L'õ',10,"10",lVar8,"archive_entry_mtime_nsec(ae)",(void *)0x0);
  tVar7 = archive_entry_atime(local_470);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                      ,L'ö',0,"0",tVar7,"archive_entry_atime(ae)",(void *)0x0);
  tVar7 = archive_entry_ctime(local_470);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                      ,L'÷',0,"0",tVar7,"archive_entry_ctime(ae)",(void *)0x0);
  pcVar9 = archive_entry_pathname(local_470);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
             ,L'ø',"file","\"file\"",pcVar9,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
  mVar3 = archive_entry_filetype(local_470);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                      ,L'ù',0x8000,"AE_IFREG",(ulong)mVar3,"archive_entry_filetype(ae)",(void *)0x0
                     );
  mVar3 = archive_entry_mode(local_470);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                      ,L'ú',0x81ed,"AE_IFREG | 0755",(ulong)mVar3,"archive_entry_mode(ae)",
                      (void *)0x0);
  lVar11 = archive_entry_size(local_470);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                      ,L'û',0x81000,"0x81000",lVar11,"archive_entry_size(ae)",(void *)0x0);
  wVar4 = archive_entry_sparse_reset(local_470);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                      ,L'ý',2,"2",(long)wVar4,"archive_entry_sparse_reset(ae)",(void *)0x0);
  wVar4 = archive_entry_sparse_next(local_470,&local_448,&local_450);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                      ,L'þ',0,"0",(long)wVar4,"archive_entry_sparse_next(ae, &offset, &length)",
                      (void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                      ,L'ÿ',0x10000,"0x10000",local_448,"offset",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                      ,L'Ā',0x1000,"0x1000",local_450,"length",(void *)0x0);
  wVar4 = archive_entry_sparse_next(local_470,&local_448,&local_450);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                      ,L'ā',0,"0",(long)wVar4,"archive_entry_sparse_next(ae, &offset, &length)",
                      (void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                      ,L'Ă',0x80000,"0x80000",local_448,"offset",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                      ,L'ă',0x1000,"0x1000",local_450,"length",(void *)0x0);
  memset(local_438,0,0x400);
  uVar13 = 0;
  do {
    lVar10 = archive_read_data(local_468,paVar6,0x400);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                        ,L'ć',0x400,"1024",lVar10,"archive_read_data(a, buff2, 1024)",(void *)0x0);
    failure("Read data(0x%lx - 0x%lx) should be all zero",uVar13,uVar13 + 0x400);
    assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                        ,L'Ċ',paVar6,"buff2",local_438,"buff3",0x400,"1024",(void *)0x0);
    bVar14 = uVar13 < 0xfc00;
    uVar13 = uVar13 + 0x400;
  } while (bVar14);
  memset(local_438,0x61,0x400);
  uVar13 = 0x10000;
  do {
    lVar10 = archive_read_data(local_468,paVar6,0x400);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                        ,L'Ď',0x400,"1024",lVar10,"archive_read_data(a, buff2, 1024)",(void *)0x0);
    failure("Read data(0x%lx - 0x%lx) should be all \'a\'",uVar13,uVar13 + 0x400);
    assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                        ,L'đ',paVar6,"buff2",local_438,"buff3",0x400,"1024",(void *)0x0);
    bVar14 = uVar13 < 0x10c00;
    uVar13 = uVar13 + 0x400;
  } while (bVar14);
  memset(local_438,0,0x400);
  uVar13 = 0x11000;
  do {
    lVar10 = archive_read_data(local_468,paVar6,0x400);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                        ,L'ĕ',0x400,"1024",lVar10,"archive_read_data(a, buff2, 1024)",(void *)0x0);
    failure("Read data(0x%lx - 0x%lx) should be all zero",uVar13,uVar13 + 0x400);
    assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                        ,L'Ę',paVar6,"buff2",local_438,"buff3",0x400,"1024",(void *)0x0);
    bVar14 = uVar13 < 0x7fc00;
    uVar13 = uVar13 + 0x400;
  } while (bVar14);
  memset(local_438,0,0x400);
  paVar6 = local_460;
  uVar13 = 0x80000;
  do {
    lVar10 = archive_read_data(local_468,paVar6,0x400);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                        ,L'Ĝ',0x400,"1024",lVar10,"archive_read_data(a, buff2, 1024)",(void *)0x0);
    failure("Read data(0x%lx - 0x%lx) should be all \'a\'",uVar13,uVar13 + 0x400);
    assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                        ,L'ğ',paVar6,"buff2",local_438,"buff3",0x400,"1024",(void *)0x0);
    paVar12 = local_468;
    bVar14 = uVar13 < 0x80c00;
    uVar13 = uVar13 + 0x400;
  } while (bVar14);
  iVar2 = archive_read_next_header(local_468,&local_470);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                      ,L'Ĥ',1,"ARCHIVE_EOF",(long)iVar2,"archive_read_next_header(a, &ae)",paVar12)
  ;
  iVar2 = archive_read_close(paVar12);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                      ,L'ĥ',0,"ARCHIVE_OK",(long)iVar2,"archive_read_close(a)",paVar12);
  iVar2 = archive_read_free(paVar12);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                      ,L'Ħ',0,"ARCHIVE_OK",(long)iVar2,"archive_read_free(a)",(void *)0x0);
  free(local_460);
  return;
}

Assistant:

static void
test_1(void)
{
	struct archive_entry *ae;
	struct archive *a;
	size_t used;
	size_t blocksize;
	int64_t offset, length;
	char *buff2;
	size_t buff2_size = 0x13000;
	char buff3[1024];
	unsigned long i;

	assert((buff2 = malloc(buff2_size)) != NULL);
	/* Repeat the following for a variety of odd blocksizes. */
	for (blocksize = 1; blocksize < 100000; blocksize += blocksize + 3) {
		/* Create a new archive in memory. */
		assert((a = archive_write_new()) != NULL);
		assertEqualIntA(a, ARCHIVE_OK,
		    archive_write_set_format_pax(a));
		assertEqualIntA(a, ARCHIVE_OK,
		    archive_write_add_filter_none(a));
		assertEqualIntA(a, ARCHIVE_OK,
		    archive_write_set_bytes_per_block(a, (int)blocksize));
		assertEqualIntA(a, ARCHIVE_OK,
		    archive_write_set_bytes_in_last_block(a, (int)blocksize));
		assertEqualInt(blocksize,
		    archive_write_get_bytes_in_last_block(a));
		assertEqualIntA(a, ARCHIVE_OK,
		    archive_write_open_memory(a, buff, sizeof(buff), &used));
		assertEqualInt(blocksize,
		    archive_write_get_bytes_in_last_block(a));

		/*
		 * Write a file to it.
		 */
		assert((ae = archive_entry_new()) != NULL);
		archive_entry_set_mtime(ae, 1, 10);
		assertEqualInt(1, archive_entry_mtime(ae));
		assertEqualInt(10, archive_entry_mtime_nsec(ae));
		archive_entry_copy_pathname(ae, "file");
		assertEqualString("file", archive_entry_pathname(ae));
		archive_entry_set_mode(ae, S_IFREG | 0755);
		assertEqualInt(S_IFREG | 0755, archive_entry_mode(ae));
		archive_entry_set_size(ae, 0x81000);
		archive_entry_sparse_add_entry(ae, 0x10000, 0x1000);
		archive_entry_sparse_add_entry(ae, 0x80000, 0x1000);

		assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
		archive_entry_free(ae);
		memset(buff2, 'a', buff2_size);
		for (i = 0; i < 0x81000;) {
			size_t ws = buff2_size;
			if (i + ws > 0x81000)
				ws = 0x81000 - i;
			assertEqualInt(ws,
				archive_write_data(a, buff2, ws));
			i += (long)ws;
		}

		/* Close out the archive. */
		assertEqualIntA(a, ARCHIVE_OK, archive_write_close(a));
		assertEqualInt(ARCHIVE_OK, archive_write_free(a));

		/* This calculation gives "the smallest multiple of
		 * the block size that is at least 11264 bytes". */
		failure("blocksize=%zu", blocksize);
		assertEqualInt(((11264 - 1)/blocksize+1)*blocksize, used);

		/*
		 * Now, read the data back.
		 */
		assert((a = archive_read_new()) != NULL);
		assertEqualIntA(a, ARCHIVE_OK,
		    archive_read_support_format_all(a));
		assertEqualIntA(a, ARCHIVE_OK,
		    archive_read_support_filter_all(a));
		assertEqualIntA(a, ARCHIVE_OK,
		    archive_read_open_memory(a, buff, used));

		assertEqualIntA(a, ARCHIVE_OK,
		    archive_read_next_header(a, &ae));

		assertEqualInt(1, archive_entry_mtime(ae));
		assertEqualInt(10, archive_entry_mtime_nsec(ae));
		assertEqualInt(0, archive_entry_atime(ae));
		assertEqualInt(0, archive_entry_ctime(ae));
		assertEqualString("file", archive_entry_pathname(ae));
		assertEqualInt(AE_IFREG, archive_entry_filetype(ae));
		assertEqualInt(AE_IFREG | 0755, archive_entry_mode(ae));
		assertEqualInt(0x81000, archive_entry_size(ae));
		/* Verify sparse information. */
		assertEqualInt(2, archive_entry_sparse_reset(ae));
		assertEqualInt(0,
			archive_entry_sparse_next(ae, &offset, &length));
		assertEqualInt(0x10000, offset);
		assertEqualInt(0x1000, length);
		assertEqualInt(0,
			archive_entry_sparse_next(ae, &offset, &length));
		assertEqualInt(0x80000, offset);
		assertEqualInt(0x1000, length);
		/* Verify file contents. */
		memset(buff3, 0, sizeof(buff3));
		for (i = 0; i < 0x10000; i += 1024) {
			assertEqualInt(1024, archive_read_data(a, buff2, 1024));
			failure("Read data(0x%lx - 0x%lx) should be all zero",
			    i, i + 1024);
			assertEqualMem(buff2, buff3, 1024);
		}
		memset(buff3, 'a', sizeof(buff3));
		for (i = 0x10000; i < 0x11000; i += 1024) {
			assertEqualInt(1024, archive_read_data(a, buff2, 1024));
			failure("Read data(0x%lx - 0x%lx) should be all 'a'",
			    i, i + 1024);
			assertEqualMem(buff2, buff3, 1024);
		}
		memset(buff3, 0, sizeof(buff3));
		for (i = 0x11000; i < 0x80000; i += 1024) {
			assertEqualInt(1024, archive_read_data(a, buff2, 1024));
			failure("Read data(0x%lx - 0x%lx) should be all zero",
			    i, i + 1024);
			assertEqualMem(buff2, buff3, 1024);
		}
		memset(buff3, 'a', sizeof(buff3));
		for (i = 0x80000; i < 0x81000; i += 1024) {
			assertEqualInt(1024, archive_read_data(a, buff2, 1024));
			failure("Read data(0x%lx - 0x%lx) should be all 'a'",
			    i, i + 1024);
			assertEqualMem(buff2, buff3, 1024);
		}

		/* Verify the end of the archive. */
		assertEqualIntA(a, ARCHIVE_EOF,
		    archive_read_next_header(a, &ae));
		assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
		assertEqualInt(ARCHIVE_OK, archive_read_free(a));
	}
	free(buff2);
}